

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

Executor * __thiscall kj::EventLoop::getExecutor(EventLoop *this)

{
  Disposer *pDVar1;
  Executor *pEVar2;
  AtomicRefcounted *refcounted;
  Executor *pEVar3;
  Own<kj::Executor::Impl,_std::nullptr_t> OVar4;
  
  pEVar3 = (this->executor).ptr.ptr;
  if (pEVar3 == (Executor *)0x0) {
    pEVar3 = (Executor *)operator_new(0x28);
    pEVar3->_vptr_Executor = (_func_int **)&PTR___cxa_pure_virtual_00620900;
    OVar4 = heap<kj::Executor::Impl,kj::EventLoop&>((kj *)&pEVar3->impl,this);
    *(undefined4 *)&pEVar3[1].impl.disposer = 0;
    pEVar3->_vptr_Executor = (_func_int **)&PTR_addRef_00620c60;
    pEVar3[1]._vptr_Executor = (_func_int **)&DAT_00620c88;
    LOCK();
    *(int *)&pEVar3[1].impl.disposer = *(int *)&pEVar3[1].impl.disposer + 1;
    UNLOCK();
    pDVar1 = (this->executor).ptr.disposer;
    pEVar2 = (this->executor).ptr.ptr;
    (this->executor).ptr.disposer = (Disposer *)(pEVar3 + 1);
    (this->executor).ptr.ptr = pEVar3;
    if (pEVar2 != (Executor *)0x0) {
      (**pDVar1->_vptr_Disposer)
                (pDVar1,(_func_int *)
                        ((long)&pEVar2->_vptr_Executor + (long)pEVar2->_vptr_Executor[-2]),OVar4.ptr
                );
      pEVar3 = (this->executor).ptr.ptr;
    }
  }
  return pEVar3;
}

Assistant:

kj::String trace() {
    void* space[32]{};
    _::TraceBuilder builder(space);
    node->tracePromise(builder, false);
    return kj::str("task: ", builder);
  }